

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O0

void __thiscall VariationalBayesEstimatorOnLDA::runIteraions(VariationalBayesEstimatorOnLDA *this)

{
  uint uVar1;
  ostream *poVar2;
  int __x;
  double extraout_XMM0_Qa;
  double dVar3;
  double extraout_XMM0_Qa_00;
  uint local_24;
  double dStack_20;
  uint count;
  double thisVariationalLowerBound;
  double prevVariationalLowerBound;
  VariationalBayesEstimatorOnLDA *this_local;
  vector<double,_std::allocator<double>_> *this_00;
  
  dStack_20 = 0.0;
  local_24 = 0;
  prevVariationalLowerBound = (double)this;
  do {
    thisVariationalLowerBound = dStack_20;
    (*this->_vptr_VariationalBayesEstimatorOnLDA[6])();
    (*this->_vptr_VariationalBayesEstimatorOnLDA[7])();
    (*this->_vptr_VariationalBayesEstimatorOnLDA[10])();
    dStack_20 = extraout_XMM0_Qa;
    poVar2 = std::operator<<((ostream *)&std::cout,"VLB");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dStack_20);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_00 = &this->_VLBTimeSeries;
    std::vector<double,_std::allocator<double>_>::push_back(this_00,&stack0xffffffffffffffe0);
    __x = (int)this_00;
    local_24 = local_24 + 1;
    uVar1 = std::isnan(dStack_20);
    if ((uVar1 & 1) != 0) {
LAB_00126bd3:
      (*this->_vptr_VariationalBayesEstimatorOnLDA[4])();
      poVar2 = std::operator<<((ostream *)&std::cout,"iter:");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_24);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      return;
    }
    if ((1 < local_24) &&
       (dVar3 = dStack_20 - thisVariationalLowerBound, std::abs(__x),
       dVar3 / extraout_XMM0_Qa_00 < this->_convergenceDiterminationRate)) {
      this->_variationalLowerBound = dStack_20;
      goto LAB_00126bd3;
    }
    (*this->_vptr_VariationalBayesEstimatorOnLDA[9])();
  } while( true );
}

Assistant:

void VariationalBayesEstimatorOnLDA::runIteraions(){//{{{
    double prevVariationalLowerBound = 0;
    double thisVariationalLowerBound = 0;
    unsigned int count = 0;
    while(1){
        prevVariationalLowerBound = thisVariationalLowerBound;
        this->updateQz();
        this->updateNEx();
        thisVariationalLowerBound = this->calculateVariationalLowerBound();
        cout<<"VLB"<<thisVariationalLowerBound<<endl;
        _VLBTimeSeries.push_back(thisVariationalLowerBound);
        count++;
        if(std::isnan(thisVariationalLowerBound))break;
        if(count<2){
        }else if((thisVariationalLowerBound - prevVariationalLowerBound) / abs(thisVariationalLowerBound) < _convergenceDiterminationRate){
            _variationalLowerBound = thisVariationalLowerBound;
            break;
        }
        this->updateHyperParameters();
    }
    this->calculateEx();
    cout<<"iter:"<<count<<endl;
}